

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O1

void EdgeDetectionHelper::find
               (EdgeDetectionBase<float> *edgeDetection,Image *image,uint32_t x,uint32_t y,
               uint32_t width,uint32_t height,EdgeParameter *edgeParameter)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uchar *__n;
  uint uVar4;
  ulong uVar5;
  EVP_PKEY_CTX *pEVar6;
  uint uVar7;
  uchar *sig;
  uint *puVar8;
  ulong uVar9;
  uchar *tbs;
  undefined4 in_register_0000008c;
  size_t tbslen;
  EVP_PKEY_CTX *pEVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  vector<float,_std::allocator<float>_> edgePositive;
  vector<float,_std::allocator<float>_> edgeNegative;
  vector<int,_std::allocator<int>_> secondDerivative;
  vector<int,_std::allocator<int>_> firstDerivative;
  vector<int,_std::allocator<int>_> data;
  vector<float,_std::allocator<float>_> local_c8;
  uchar *local_a8;
  EdgeDetectionBase<float> *local_a0;
  vector<float,_std::allocator<float>_> local_98;
  vector<PointBase2D<float>,_std::allocator<PointBase2D<float>_>_> *local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  auVar13 = in_ZMM1._0_16_;
  auVar12 = in_ZMM0._0_16_;
  tbslen = CONCAT44(in_register_0000008c,height);
  __n = (uchar *)(ulong)height;
  uVar11 = (ulong)width;
  pEVar10 = (EVP_PKEY_CTX *)(ulong)x;
  local_a0 = edgeDetection;
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  uVar5 = uVar11;
  pEVar6 = pEVar10;
  tbs = __n;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (image,x,y,width,height);
  EdgeParameter::verify(edgeParameter,pEVar6,sig,uVar5,tbs,tbslen);
  if (edgeParameter->direction < TOP_TO_BOTTOM) {
    height = width;
  }
  if (3 < height) {
    local_80 = &local_a0->negativeEdgePoint;
    uVar1 = image->_rowSize;
    local_a8 = __n;
    if (edgeParameter->direction < TOP_TO_BOTTOM) {
      std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar11,(allocator_type *)&local_60);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,uVar11,(value_type_conflict3 *)&local_78,(allocator_type *)&local_c8);
      local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,uVar11,(value_type_conflict3 *)&local_c8,(allocator_type *)&local_98);
      uVar4 = (int)local_a8 + 1;
      local_a8 = (uchar *)(ulong)uVar4;
      if (uVar4 != edgeParameter->groupFactor) {
        auVar12 = vcvtusi2ss_avx512f(auVar12,(x - 1) + width);
        pEVar10 = pEVar10 + (long)(image->_data + uVar1 * y);
        auVar13 = vcvtusi2ss_avx512f(auVar13,x);
        uVar4 = 0;
        do {
          if (width != 0) {
            uVar5 = 0;
            do {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar5] = (uint)(byte)pEVar10[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar11 != uVar5);
          }
          if (1 < edgeParameter->groupFactor) {
            uVar5 = 1;
            uVar7 = uVar1;
            do {
              if (width != 0) {
                uVar9 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9] =
                       local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar9] + (uint)(byte)pEVar10[uVar9 + uVar7];
                  uVar9 = uVar9 + 1;
                } while (uVar11 != uVar9);
              }
              uVar5 = uVar5 + 1;
              uVar7 = uVar7 + uVar1;
            } while (uVar5 < edgeParameter->groupFactor);
          }
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          anon_unknown.dwarf_8edeb::findEdgePoints<float>
                    (&local_c8,&local_98,&local_48,&local_60,&local_78,edgeParameter,
                     edgeParameter->direction == LEFT_TO_RIGHT);
          if (edgeParameter->direction == LEFT_TO_RIGHT) {
            if ((edgeParameter->gradient | 2) == ANY) {
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,y + uVar4);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createPositiveXEdge<float>
                        (&local_c8,&local_a0->positiveEdgePoint,auVar13._0_4_,
                         auVar3._0_4_ * 0.5 + auVar2._0_4_);
            }
            if (edgeParameter->gradient - NEGATIVE < 2) {
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,y + uVar4);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createNegativeXEdge<float>
                        (&local_98,local_80,auVar12._0_4_,auVar3._0_4_ * 0.5 + auVar2._0_4_);
            }
          }
          else {
            if ((edgeParameter->gradient | 2) == ANY) {
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,y + uVar4);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createNegativeXEdge<float>
                        (&local_98,&local_a0->positiveEdgePoint,auVar12._0_4_,
                         auVar3._0_4_ * 0.5 + auVar2._0_4_);
            }
            if (edgeParameter->gradient - NEGATIVE < 2) {
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,y + uVar4);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createPositiveXEdge<float>
                        (&local_c8,local_80,auVar13._0_4_,auVar3._0_4_ * 0.5 + auVar2._0_4_);
            }
          }
          if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar4 = uVar4 + edgeParameter->skipFactor;
          pEVar10 = pEVar10 + edgeParameter->skipFactor * uVar1;
        } while (uVar4 < (int)local_a8 - edgeParameter->groupFactor);
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_48,(size_type)__n,(allocator_type *)&local_60);
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_60,(size_type)__n,(value_type_conflict3 *)&local_78,
                 (allocator_type *)&local_c8);
      local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start._4_4_ << 0x20);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_78,(size_type)__n,(value_type_conflict3 *)&local_c8,
                 (allocator_type *)&local_98);
      if (width + 1 != edgeParameter->groupFactor) {
        pEVar10 = pEVar10 + (long)(image->_data + uVar1 * y);
        auVar12 = vcvtusi2ss_avx512f(auVar12,(y - 1) + (int)local_a8);
        uVar11 = (ulong)(uVar1 * (int)local_a8);
        auVar13 = vcvtusi2ss_avx512f(auVar13,y);
        uVar4 = 0;
        do {
          if (uVar11 != 0) {
            uVar5 = 0;
            puVar8 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
            do {
              *puVar8 = (uint)(byte)pEVar10[uVar5];
              puVar8 = puVar8 + 1;
              uVar5 = uVar5 + uVar1;
            } while (uVar11 != uVar5);
          }
          if (1 < edgeParameter->groupFactor) {
            uVar5 = 1;
            pEVar6 = pEVar10;
            do {
              pEVar6 = pEVar6 + 1;
              if (uVar11 != 0) {
                uVar9 = 0;
                puVar8 = (uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                do {
                  *puVar8 = *puVar8 + (uint)(byte)pEVar6[uVar9];
                  puVar8 = puVar8 + 1;
                  uVar9 = uVar9 + uVar1;
                } while (uVar11 != uVar9);
              }
              uVar5 = uVar5 + 1;
            } while (uVar5 < edgeParameter->groupFactor);
          }
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = (pointer)0x0;
          local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish = (pointer)0x0;
          anon_unknown.dwarf_8edeb::findEdgePoints<float>
                    (&local_c8,&local_98,&local_48,&local_60,&local_78,edgeParameter,
                     edgeParameter->direction == TOP_TO_BOTTOM);
          if (edgeParameter->direction == TOP_TO_BOTTOM) {
            if ((edgeParameter->gradient | 2) == ANY) {
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,x + uVar4);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createPositiveYEdge<float>
                        (&local_c8,&local_a0->positiveEdgePoint,auVar3._0_4_ * 0.5 + auVar2._0_4_,
                         auVar13._0_4_);
            }
            if (edgeParameter->gradient - NEGATIVE < 2) {
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,x + uVar4);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createNegativeYEdge<float>
                        (&local_98,local_80,auVar3._0_4_ * 0.5 + auVar2._0_4_,auVar12._0_4_);
            }
          }
          else {
            if ((edgeParameter->gradient | 2) == ANY) {
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,x + uVar4);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createNegativeYEdge<float>
                        (&local_98,&local_a0->positiveEdgePoint,auVar3._0_4_ * 0.5 + auVar2._0_4_,
                         auVar12._0_4_);
            }
            if (edgeParameter->gradient - NEGATIVE < 2) {
              auVar2 = vcvtusi2ss_avx512f(in_XMM2,x + uVar4);
              auVar3 = vcvtusi2ss_avx512f(in_XMM2,edgeParameter->groupFactor - 1);
              anon_unknown.dwarf_8edeb::createPositiveYEdge<float>
                        (&local_c8,local_80,auVar3._0_4_ * 0.5 + auVar2._0_4_,auVar13._0_4_);
            }
          }
          if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_c8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar4 = uVar4 + edgeParameter->skipFactor;
          pEVar10 = pEVar10 + edgeParameter->skipFactor;
        } while (uVar4 < (width + 1) - edgeParameter->groupFactor);
      }
    }
    if ((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_78.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((uint *)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void EdgeDetectionHelper::find( EdgeDetectionBase<float> & edgeDetection, const PenguinV_Image::Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height,
                                const EdgeParameter & edgeParameter )
{
    findEdgePoints( image, x, y, width, height, edgeParameter, edgeDetection.positiveEdgePoint, edgeDetection.negativeEdgePoint );
}